

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O0

bool __thiscall draco::PlyReader::ParseElement(PlyReader *this,DecoderBuffer *buffer)

{
  bool bVar1;
  undefined4 uVar2;
  size_type sVar3;
  const_reference pvVar4;
  char *__nptr;
  undefined8 *in_RSI;
  PlyElement *in_RDI;
  string count_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  int64_t count;
  string element_name;
  string line;
  DecoderBuffer line_buffer;
  char *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  PlyElement *in_stack_fffffffffffffe80;
  key_type *in_stack_fffffffffffffea8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffffeb0;
  string local_e8 [8];
  string *in_stack_ffffffffffffff20;
  PlyReader *in_stack_ffffffffffffff28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  longlong local_b0;
  string local_a8 [48];
  string local_78 [32];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 *local_18;
  byte local_1;
  
  local_28 = in_RSI[6];
  local_58 = *in_RSI;
  uStack_50 = in_RSI[1];
  local_48 = in_RSI[2];
  uStack_40 = in_RSI[3];
  local_38 = in_RSI[4];
  uStack_30 = in_RSI[5];
  local_18 = in_RSI;
  std::__cxx11::string::string(local_78);
  parser::ParseLine((DecoderBuffer *)in_stack_fffffffffffffe80,
                    (string *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::__cxx11::string::string(local_a8);
  SplitWords(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_c8);
  if (2 < sVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_c8,0);
    bVar1 = std::operator==(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    if (bVar1) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_c8,1);
      std::__cxx11::string::operator=(local_a8,(string *)pvVar4);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_c8,2);
      std::__cxx11::string::string(local_e8,(string *)pvVar4);
      __nptr = (char *)std::__cxx11::string::c_str();
      local_b0 = strtoll(__nptr,(char **)0x0,10);
      std::__cxx11::string::~string(local_e8);
      sVar3 = std::vector<draco::PlyElement,_std::allocator<draco::PlyElement>_>::size
                        ((vector<draco::PlyElement,_std::allocator<draco::PlyElement>_> *)in_RDI);
      uVar2 = (undefined4)sVar3;
      in_stack_fffffffffffffe80 =
           (PlyElement *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      *(undefined4 *)&in_stack_fffffffffffffe80->name_ = uVar2;
      PlyElement::PlyElement
                (in_stack_fffffffffffffe80,(string *)CONCAT44(uVar2,in_stack_fffffffffffffe78),
                 (int64_t)in_RDI);
      std::vector<draco::PlyElement,_std::allocator<draco::PlyElement>_>::
      emplace_back<draco::PlyElement>
                ((vector<draco::PlyElement,_std::allocator<draco::PlyElement>_> *)
                 in_stack_fffffffffffffe80,(PlyElement *)CONCAT44(uVar2,in_stack_fffffffffffffe78));
      PlyElement::~PlyElement(in_RDI);
      memcpy(local_18,&local_58,0x34);
      local_1 = 1;
      goto LAB_0014438a;
    }
  }
  local_1 = 0;
LAB_0014438a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_78);
  DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x1443be);
  return (bool)(local_1 & 1);
}

Assistant:

bool PlyReader::ParseElement(DecoderBuffer *buffer) {
  DecoderBuffer line_buffer(*buffer);
  std::string line;
  parser::ParseLine(&line_buffer, &line);

  std::string element_name;
  int64_t count;
  const std::vector<std::string> words = SplitWords(line);
  if (words.size() >= 3 && words[0] == "element") {
    element_name = words[1];
    const std::string count_str = words[2];
    count = strtoll(count_str.c_str(), nullptr, 10);
  } else {
    return false;
  }
  element_index_[element_name] = static_cast<uint32_t>(elements_.size());
  elements_.emplace_back(PlyElement(element_name, count));
  *buffer = line_buffer;
  return true;
}